

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_set_key(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,node);
  (pNVar1->m_key).scalar.str = key.str;
  (pNVar1->m_key).scalar.len = key.len;
  _add_flags(this,node,more_flags | 2);
  return;
}

Assistant:

void _set_key(size_t node, csubstr key, type_bits more_flags=0)
    {
        _p(node)->m_key.scalar = key;
        _add_flags(node, KEY|more_flags);
    }